

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O0

void RigidBodyDynamics::CalcContactJacobian
               (Model *model,VectorNd *Q,ConstraintSet *CS,MatrixNd *G,bool update_kinematics)

{
  bool bVar1;
  size_t sVar2;
  const_reference pvVar3;
  dense_product_base<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
  *this;
  long in_RDX;
  double *in_RSI;
  double *in_RDI;
  byte in_R8B;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  PVar4;
  Vector3d gaxis;
  MatrixNd Gi;
  Vector3d prev_body_point;
  uint prev_body_id;
  uint j;
  uint i;
  VectorNd *in_stack_00000258;
  VectorNd *in_stack_00000260;
  VectorNd *in_stack_00000268;
  Model *in_stack_00000270;
  undefined1 in_stack_0000033f;
  MatrixNd *in_stack_00000340;
  Vector3d *in_stack_00000348;
  uint in_stack_00000354;
  VectorNd *in_stack_00000358;
  Model *in_stack_00000360;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffed8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffffee0;
  RhsNested in_stack_fffffffffffffee8;
  LhsNested in_stack_fffffffffffffef0;
  int *in_stack_fffffffffffffef8;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffff00;
  double *in_stack_ffffffffffffff18;
  double *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  value_type in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  value_type vVar5;
  value_type local_30;
  uint local_2c;
  uint local_28;
  
  if ((in_R8B & 1) != 0) {
    UpdateKinematicsCustom(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258);
  }
  local_30 = 0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (uint *)in_stack_fffffffffffffef0.m_matrix);
  PVar4.m_rhs = in_stack_fffffffffffffee8;
  PVar4.m_lhs.m_matrix = in_stack_fffffffffffffef0.m_matrix;
  local_28 = 0;
  do {
    sVar2 = ConstraintSet::size((ConstraintSet *)0x14d996);
    if (sVar2 <= local_28) {
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x14dca8);
      return;
    }
    vVar5 = local_30;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDX + 0x20),
                        (ulong)local_28);
    if (vVar5 == *pvVar3) {
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RDX + 0x38),(ulong)local_28);
      bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator!=
                        ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         PVar4.m_lhs.m_matrix.m_matrix,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)PVar4.m_rhs);
      in_stack_ffffffffffffff30 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff30);
      if (bVar1) goto LAB_0014da1d;
    }
    else {
LAB_0014da1d:
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffee0);
      in_stack_ffffffffffffff18 = in_RDI;
      in_stack_ffffffffffffff20 = in_RSI;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDX + 0x20),
                          (ulong)local_28);
      in_stack_ffffffffffffff2c = *pvVar3;
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RDX + 0x38),(ulong)local_28);
      CalcPointJacobian(in_stack_00000360,in_stack_00000358,in_stack_00000354,in_stack_00000348,
                        in_stack_00000340,(bool)in_stack_0000033f);
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDX + 0x20),
                          (ulong)local_28);
      local_30 = *pvVar3;
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RDX + 0x38),(ulong)local_28);
      Vector3_t::operator=
                ((Vector3_t *)in_stack_fffffffffffffee0,(Vector3_t *)in_stack_fffffffffffffed8);
    }
    for (local_2c = 0; local_2c < *(uint *)(in_RDI + 9); local_2c = local_2c + 1) {
      this = (dense_product_base<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
              *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          (in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x14db57);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                (in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x14db79);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                (in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x14db9b);
      Vector3_t::Vector3_t
                ((Vector3_t *)CONCAT44(vVar5,in_stack_ffffffffffffff30),
                 (double *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffed8);
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RDX + 0x50),(ulong)local_28);
      PVar4 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                         in_stack_fffffffffffffee0,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_fffffffffffffed8);
      in_stack_fffffffffffffee0 =
           (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
           Eigen::internal::dense_product_base::operator_cast_to_double(this);
      in_stack_fffffffffffffed8 =
           (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        (in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x14dc59);
      *(DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> **)in_stack_fffffffffffffed8 =
           in_stack_fffffffffffffee0;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

RBDL_DLLAPI
void CalcContactJacobian(
		Model &model,
		const Math::VectorNd &Q,
		const ConstraintSet &CS,
		Math::MatrixNd &G,
		bool update_kinematics
		) {
	if (update_kinematics)
		UpdateKinematicsCustom (model, &Q, NULL, NULL);

	unsigned int i,j;

	// variables to check whether we need to recompute G
	unsigned int prev_body_id = 0;
	Vector3d prev_body_point = Vector3d::Zero();
	MatrixNd Gi (3, model.dof_count);

	for (i = 0; i < CS.size(); i++) {
		// only compute the matrix Gi if actually needed
		if (prev_body_id != CS.body[i] || prev_body_point != CS.point[i]) {
			Gi.setZero();
			CalcPointJacobian (model, Q, CS.body[i], CS.point[i], Gi, false);
			prev_body_id = CS.body[i];
			prev_body_point = CS.point[i];
		}

		for (j = 0; j < model.dof_count; j++) {
			Vector3d gaxis (Gi(0,j), Gi(1,j), Gi(2,j));
			G(i,j) = gaxis.transpose() * CS.normal[i];
		}
	}
}